

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

PKCS12 * PKCS12_create(char *pass,char *name,EVP_PKEY *pkey,X509 *cert,stack_st_X509 *ca,int nid_key
                      ,int nid_cert,int iter,int mac_iter,int keytype)

{
  X509 *data;
  EVP_PKEY *key;
  OPENSSL_STACK *chain;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  EVP_MD *pEVar5;
  EVP_CIPHER *pEVar6;
  size_t name_len;
  undefined4 extraout_var;
  uint8_t *d;
  uchar *puVar7;
  PKCS12 *out_data;
  uint iterations;
  uint nid;
  bool bVar8;
  uint key_id_len;
  X509 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  EVP_PKEY *local_3b8;
  int n1;
  size_t local_3a8;
  OPENSSL_STACK *local_3a0;
  int local_394;
  uint8_t *ptr;
  CBB encrypted_content_info;
  CBB wrapper;
  CBB encrypted_content;
  CBB encrypted_data;
  CBB plaintext_cbb;
  CBB content_infos;
  CBB content_info;
  uint8_t salt [8];
  uint8_t mac_key [64];
  CBB auth_safe_data;
  CBB pfx;
  CBB cbb;
  uint8_t key_id [64];
  CBB auth_safe;
  CBB auth_safe_wrapper;
  
  nid = 0x92;
  if (nid_key != 0) {
    nid = nid_key;
  }
  uVar3 = 0x95;
  if (nid_cert != 0) {
    uVar3 = nid_cert;
  }
  iVar2 = 0x800;
  if (iter != 0) {
    iVar2 = iter;
  }
  iterations = mac_iter + (uint)(mac_iter == 0);
  local_3b8 = pkey;
  if (((int)iterations < 0 || keytype != 0) ||
     ((local_3d0 = cert, local_3a0 = (OPENSSL_STACK *)ca,
      pkey == (EVP_PKEY *)0x0 && cert == (X509 *)0x0 &&
      (sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)ca), sVar4 == 0)))) {
    ERR_put_error(0x13,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x444);
    return (PKCS12 *)0x0;
  }
  local_3c0 = name;
  if (pass == (char *)0x0) {
    local_3a8 = 0;
  }
  else {
    local_3a8 = strlen(pass);
  }
  data = local_3d0;
  key_id_len = 0;
  if (local_3b8 != (EVP_PKEY *)0x0 && local_3d0 != (X509 *)0x0) {
    local_3c8 = (char *)CONCAT44(local_3c8._4_4_,nid);
    iVar1 = X509_check_private_key(local_3d0,local_3b8);
    if (iVar1 == 0) {
      return (PKCS12 *)0x0;
    }
    pEVar5 = EVP_sha1();
    iVar1 = X509_digest(data,pEVar5,key_id,&key_id_len);
    nid = (uint)local_3c8;
    if (iVar1 == 0) {
      return (PKCS12 *)0x0;
    }
  }
  out_data = (PKCS12 *)0x0;
  local_3c8 = pass;
  iVar1 = CBB_init(&cbb,0);
  if (iVar1 == 0) goto LAB_00190cdc;
  iVar1 = CBB_add_asn1(&cbb,&pfx,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&pfx,3), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1(&pfx,&auth_safe,0x20000010), iVar1 != 0)) &&
      ((iVar1 = CBB_add_asn1_element(&auth_safe,6,kPKCS7Data,9), iVar1 != 0 &&
       (iVar1 = CBB_add_asn1(&auth_safe,&auth_safe_wrapper,0xa0000000), iVar1 != 0)))) &&
     ((iVar1 = CBB_add_asn1(&auth_safe_wrapper,&auth_safe_data,4), iVar1 != 0 &&
      (iVar1 = CBB_add_asn1(&auth_safe_data,&content_infos,0x20000010), chain = local_3a0,
      iVar1 != 0)))) {
    if ((local_3d0 == (X509 *)0x0) && (sVar4 = OPENSSL_sk_num(local_3a0), sVar4 == 0)) {
LAB_00190dd5:
      if (local_3b8 == (EVP_PKEY *)0x0) {
LAB_001910a6:
        pEVar5 = EVP_sha1();
        iVar2 = CBB_flush(&auth_safe_data);
        if ((iVar2 != 0) && (iVar2 = RAND_bytes((uchar *)&encrypted_content_info,8), iVar2 != 0)) {
          iVar2 = EVP_MD_size(pEVar5);
          iVar2 = pkcs12_key_gen(local_3c8,local_3a8,(uint8_t *)&encrypted_content_info,8,'\x03',
                                 iterations,CONCAT44(extraout_var,iVar2),mac_key,(EVP_MD *)pEVar5);
          if (iVar2 != 0) {
            iVar2 = EVP_MD_size(pEVar5);
            d = CBB_data(&auth_safe_data);
            sVar4 = CBB_len(&auth_safe_data);
            puVar7 = HMAC(pEVar5,mac_key,iVar2,d,sVar4,(uchar *)&content_info,
                          (uint *)&encrypted_content);
            if ((((puVar7 != (uchar *)0x0) &&
                 (iVar2 = CBB_add_asn1(&pfx,&wrapper,0x20000010), iVar2 != 0)) &&
                (iVar2 = CBB_add_asn1(&wrapper,&encrypted_data,0x20000010), iVar2 != 0)) &&
               (((iVar2 = EVP_marshal_digest_algorithm(&encrypted_data,(EVP_MD *)pEVar5), iVar2 != 0
                 && (iVar2 = CBB_add_asn1_octet_string
                                       (&encrypted_data,(uint8_t *)&content_info,
                                        (ulong)(uint)encrypted_content.child), iVar2 != 0)) &&
                ((iVar2 = CBB_add_asn1_octet_string(&wrapper,(uint8_t *)&encrypted_content_info,8),
                 iVar2 != 0 && (iVar2 = CBB_add_asn1_uint64(&wrapper,(ulong)iterations), iVar2 != 0)
                 ))))) {
              out_data = (PKCS12 *)OPENSSL_malloc(0x10);
              if ((out_data != (PKCS12 *)0x0) &&
                 (iVar2 = CBB_finish(&cbb,(uint8_t **)out_data,(size_t *)&out_data->mac), iVar2 != 0
                 )) goto LAB_00190cdc;
              OPENSSL_free(out_data);
            }
          }
        }
      }
      else {
        iVar1 = CBB_add_asn1(&content_infos,(CBB *)mac_key,0x20000010);
        if ((((iVar1 != 0) &&
             (iVar1 = CBB_add_asn1_element((CBB *)mac_key,6,kPKCS7Data,9), iVar1 != 0)) &&
            ((iVar1 = CBB_add_asn1((CBB *)mac_key,&content_info,0xa0000000), iVar1 != 0 &&
             ((iVar1 = CBB_add_asn1(&content_info,&wrapper,4), iVar1 != 0 &&
              (iVar1 = CBB_add_asn1(&wrapper,&encrypted_data,0x20000010), iVar1 != 0)))))) &&
           (iVar1 = CBB_add_asn1(&encrypted_data,&encrypted_content_info,0x20000010),
           key = local_3b8, iVar1 != 0)) {
          if ((int)nid < 0) {
            iVar2 = CBB_add_asn1_element(&encrypted_content_info,6,kKeyBag,0xb);
            if ((iVar2 != 0) &&
               (iVar2 = CBB_add_asn1(&encrypted_content_info,&encrypted_content,0xa0000000),
               iVar2 != 0)) {
              iVar2 = EVP_marshal_private_key(&encrypted_content,(EVP_PKEY *)key);
              goto LAB_00190f8b;
            }
          }
          else {
            pEVar6 = pkcs5_pbe2_nid_to_cipher(nid);
            iVar1 = CBB_add_asn1_element(&encrypted_content_info,6,kPKCS8ShroudedKeyBag,0xb);
            if ((iVar1 != 0) &&
               (iVar1 = CBB_add_asn1(&encrypted_content_info,&encrypted_content,0xa0000000),
               iVar1 != 0)) {
              iVar2 = PKCS8_marshal_encrypted_private_key
                                (&encrypted_content,-(uint)(pEVar6 != (EVP_CIPHER *)0x0) | nid,
                                 pEVar6,local_3c8,local_3a8,(uint8_t *)0x0,0,iVar2,(EVP_PKEY *)key);
LAB_00190f8b:
              if (iVar2 != 0) {
                if (local_3c0 == (char *)0x0) {
                  name_len = 0;
                }
                else {
                  name_len = strlen(local_3c0);
                }
                iVar2 = add_bag_attributes(&encrypted_content_info,local_3c0,name_len,key_id,
                                           (ulong)key_id_len);
                if ((iVar2 != 0) && (iVar2 = CBB_flush(&content_infos), iVar2 != 0))
                goto LAB_001910a6;
              }
            }
          }
        }
      }
    }
    else if ((int)uVar3 < 0) {
      iVar1 = CBB_add_asn1(&content_infos,(CBB *)mac_key,0x20000010);
      if ((((iVar1 != 0) &&
           (iVar1 = CBB_add_asn1_element((CBB *)mac_key,6,kPKCS7Data,9), iVar1 != 0)) &&
          (iVar1 = CBB_add_asn1((CBB *)mac_key,&content_info,0xa0000000), iVar1 != 0)) &&
         (((iVar1 = CBB_add_asn1(&content_info,&wrapper,4), iVar1 != 0 &&
           (iVar1 = add_cert_safe_contents
                              (&wrapper,(X509 *)local_3d0,(stack_st_X509 *)chain,local_3c0,key_id,
                               (ulong)key_id_len), iVar1 != 0)) &&
          (iVar1 = CBB_flush(&content_infos), iVar1 != 0)))) goto LAB_00190dd5;
    }
    else {
      pEVar6 = pkcs5_pbe2_nid_to_cipher(uVar3);
      iVar1 = CBB_init(&plaintext_cbb,0);
      if ((iVar1 != 0) &&
         (iVar1 = add_cert_safe_contents
                            (&plaintext_cbb,(X509 *)local_3d0,(stack_st_X509 *)chain,local_3c0,
                             key_id,(ulong)key_id_len), iVar1 != 0)) {
        local_3d0 = (X509 *)CONCAT44(local_3d0._4_4_,iVar2);
        local_3a0 = (OPENSSL_STACK *)CBB_data(&plaintext_cbb);
        sVar4 = CBB_len(&plaintext_cbb);
        iVar2 = RAND_bytes(salt,8);
        if (iVar2 != 0) {
          EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)mac_key);
          iVar2 = CBB_add_asn1(&content_infos,&content_info,0x20000010);
          if ((((iVar2 != 0) &&
               (iVar2 = CBB_add_asn1_element(&content_info,6,kPKCS7EncryptedData,9), iVar2 != 0)) &&
              (iVar2 = CBB_add_asn1(&content_info,&wrapper,0xa0000000), iVar2 != 0)) &&
             (((iVar2 = CBB_add_asn1(&wrapper,&encrypted_data,0x20000010), iVar2 != 0 &&
               (iVar2 = CBB_add_asn1_uint64(&encrypted_data,0), iVar2 != 0)) &&
              ((iVar2 = CBB_add_asn1(&encrypted_data,&encrypted_content_info,0x20000010), iVar2 != 0
               && (iVar2 = CBB_add_asn1_element(&encrypted_content_info,6,kPKCS7Data,9), iVar2 != 0)
               ))))) {
            iVar2 = pkcs12_pbe_encrypt_init
                              (&encrypted_content_info,(EVP_CIPHER_CTX *)mac_key,
                               -(uint)(pEVar6 != (EVP_CIPHER *)0x0) | uVar3,pEVar6,
                               (uint32_t)local_3d0,local_3c8,local_3a8,salt,8);
            if ((iVar2 != 0) &&
               (iVar2 = CBB_add_asn1(&encrypted_content_info,&encrypted_content,0x80000000),
               iVar2 != 0)) {
              uVar3 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)mac_key);
              if (!CARRY8((ulong)uVar3,sVar4)) {
                iVar2 = CBB_reserve(&encrypted_content,&ptr,uVar3 + sVar4);
                bVar8 = true;
                if ((((iVar2 != 0) &&
                     (iVar2 = EVP_CipherUpdate((EVP_CIPHER_CTX *)mac_key,ptr,&n1,(uchar *)local_3a0,
                                               (int)sVar4), iVar2 != 0)) &&
                    (iVar2 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)mac_key,ptr + n1,&local_394),
                    iVar2 != 0)) &&
                   (iVar2 = CBB_did_write(&encrypted_content,(long)local_394 + (long)n1), iVar2 != 0
                   )) {
                  iVar2 = CBB_flush(&content_infos);
                  bVar8 = iVar2 == 0;
                }
                EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)mac_key);
                CBB_cleanup(&plaintext_cbb);
                iVar2 = (uint32_t)local_3d0;
                if (!bVar8) goto LAB_00190dd5;
                goto LAB_00190cd9;
              }
              ERR_put_error(0x13,0,0x76,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                            ,0x41a);
            }
          }
          EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)mac_key);
        }
      }
      CBB_cleanup(&plaintext_cbb);
    }
  }
LAB_00190cd9:
  out_data = (PKCS12 *)0x0;
LAB_00190cdc:
  OPENSSL_cleanse(mac_key,0x40);
  CBB_cleanup(&cbb);
  return out_data;
}

Assistant:

PKCS12 *PKCS12_create(const char *password, const char *name,
                      const EVP_PKEY *pkey, X509 *cert,
                      const STACK_OF(X509) *chain, int key_nid, int cert_nid,
                      int iterations, int mac_iterations, int key_type) {
  // TODO(crbug.com/396434682): Improve these defaults.
  if (key_nid == 0) {
    key_nid = NID_pbe_WithSHA1And3_Key_TripleDES_CBC;
  }
  if (cert_nid == 0) {
    cert_nid = NID_pbe_WithSHA1And40BitRC2_CBC;
  }
  if (iterations == 0) {
    iterations = PKCS12_DEFAULT_ITER;
  }
  if (mac_iterations == 0) {
    mac_iterations = 1;
  }
  if (  // In OpenSSL, this specifies a non-standard Microsoft key usage
        // extension which we do not currently support.
      key_type != 0 ||
      // In OpenSSL, -1 here means to omit the MAC, which we do not
      // currently support. Omitting it is also invalid for a password-based
      // PKCS#12 file.
      mac_iterations < 0 ||
      // Don't encode empty objects.
      (pkey == NULL && cert == NULL && sk_X509_num(chain) == 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_OPTIONS);
    return 0;
  }

  // PKCS#12 is a very confusing recursive data format, built out of another
  // recursive data format. Section 5.1 of RFC 7292 describes the encoding
  // algorithm, but there is no clear overview. A quick summary:
  //
  // PKCS#7 defines a ContentInfo structure, which is a overgeneralized typed
  // combinator structure for applying cryptography. We care about two types. A
  // data ContentInfo contains an OCTET STRING and is a leaf node of the
  // combinator tree. An encrypted-data ContentInfo contains encryption
  // parameters (key derivation and encryption) and wraps another ContentInfo,
  // usually data.
  //
  // A PKCS#12 file is a PFX structure (section 4), which contains a single data
  // ContentInfo and a MAC over it. This root ContentInfo is the
  // AuthenticatedSafe and its payload is a SEQUENCE of other ContentInfos, so
  // that different parts of the PKCS#12 file can by differently protected.
  //
  // Each ContentInfo in the AuthenticatedSafe, after undoing all the PKCS#7
  // combinators, has SafeContents payload. A SafeContents is a SEQUENCE of
  // SafeBag. SafeBag is PKCS#12's typed structure, with subtypes such as KeyBag
  // and CertBag. Confusingly, there is a SafeContents bag type which itself
  // recursively contains more SafeBags, but we do not implement this. Bags also
  // can have attributes.
  //
  // The grouping of SafeBags into intermediate ContentInfos does not appear to
  // be significant, except that all SafeBags sharing a ContentInfo have the
  // same level of protection. Additionally, while keys may be encrypted by
  // placing a KeyBag in an encrypted-data ContentInfo, PKCS#12 also defines a
  // key-specific encryption container, PKCS8ShroudedKeyBag, which is used
  // instead.

  // Note that |password| may be NULL to specify no password, rather than the
  // empty string. They are encoded differently in PKCS#12. (One is the empty
  // byte array and the other is NUL-terminated UCS-2.)
  size_t password_len = password != NULL ? strlen(password) : 0;

  uint8_t key_id[EVP_MAX_MD_SIZE];
  unsigned key_id_len = 0;
  if (cert != NULL && pkey != NULL) {
    if (!X509_check_private_key(cert, pkey) ||
        // Matching OpenSSL, use the SHA-1 hash of the certificate as the local
        // key ID. Some PKCS#12 consumers require one to connect the private key
        // and certificate.
        !X509_digest(cert, EVP_sha1(), key_id, &key_id_len)) {
      return 0;
    }
  }

  // See https://tools.ietf.org/html/rfc7292#section-4.
  PKCS12 *ret = NULL;
  CBB cbb, pfx, auth_safe, auth_safe_wrapper, auth_safe_data, content_infos;
  uint8_t mac_key[EVP_MAX_MD_SIZE];
  if (!CBB_init(&cbb, 0) || !CBB_add_asn1(&cbb, &pfx, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pfx, 3) ||
      // auth_safe is a data ContentInfo.
      !CBB_add_asn1(&pfx, &auth_safe, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&auth_safe, CBS_ASN1_OBJECT, kPKCS7Data,
                            sizeof(kPKCS7Data)) ||
      !CBB_add_asn1(&auth_safe, &auth_safe_wrapper,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      !CBB_add_asn1(&auth_safe_wrapper, &auth_safe_data,
                    CBS_ASN1_OCTETSTRING) ||
      // See https://tools.ietf.org/html/rfc7292#section-4.1. |auth_safe|'s
      // contains a SEQUENCE of ContentInfos.
      !CBB_add_asn1(&auth_safe_data, &content_infos, CBS_ASN1_SEQUENCE)) {
    goto err;
  }

  // If there are any certificates, place them in CertBags wrapped in a single
  // encrypted ContentInfo.
  if (cert != NULL || sk_X509_num(chain) > 0) {
    if (cert_nid < 0) {
      // Place the certificates in an unencrypted ContentInfo. This could be
      // more compactly-encoded by reusing the same ContentInfo as the key, but
      // OpenSSL does not do this. We keep them separate for consistency. (Keys,
      // even when encrypted, are always placed in unencrypted ContentInfos.
      // PKCS#12 defines bag-level encryption for keys.)
      CBB content_info, wrapper, data;
      if (!CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
          !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                                sizeof(kPKCS7Data)) ||
          !CBB_add_asn1(&content_info, &wrapper,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
          !add_cert_safe_contents(&data, cert, chain, name, key_id,
                                  key_id_len) ||
          !CBB_flush(&content_infos)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(cert_nid);
      if (cipher != nullptr) {
        cert_nid = -1;
      }
      CBB plaintext_cbb;
      int ok =
          CBB_init(&plaintext_cbb, 0) &&
          add_cert_safe_contents(&plaintext_cbb, cert, chain, name, key_id,
                                 key_id_len) &&
          add_encrypted_data(&content_infos, cert_nid, cipher, password,
                             password_len, iterations, CBB_data(&plaintext_cbb),
                             CBB_len(&plaintext_cbb));
      CBB_cleanup(&plaintext_cbb);
      if (!ok) {
        goto err;
      }
    }
  }

  // If there is a key, place it in a single KeyBag or PKCS8ShroudedKeyBag
  // wrapped in an unencrypted ContentInfo. (One could also place it in a KeyBag
  // inside an encrypted ContentInfo, but OpenSSL does not do this and some
  // PKCS#12 consumers do not support KeyBags.)
  if (pkey != NULL) {
    CBB content_info, wrapper, data, safe_contents, bag, bag_contents;
    if (  // Add another data ContentInfo.
        !CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                              sizeof(kPKCS7Data)) ||
        !CBB_add_asn1(&content_info, &wrapper,
                      CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
        !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
        !CBB_add_asn1(&data, &safe_contents, CBS_ASN1_SEQUENCE) ||
        // Add a SafeBag containing a PKCS8ShroudedKeyBag.
        !CBB_add_asn1(&safe_contents, &bag, CBS_ASN1_SEQUENCE)) {
      goto err;
    }
    if (key_nid < 0) {
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kKeyBag,
                                sizeof(kKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !EVP_marshal_private_key(&bag_contents, pkey)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(key_nid);
      if (cipher != nullptr) {
        key_nid = -1;
      }
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kPKCS8ShroudedKeyBag,
                                sizeof(kPKCS8ShroudedKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !PKCS8_marshal_encrypted_private_key(
              &bag_contents, key_nid, cipher, password, password_len,
              NULL /* generate a random salt */,
              0 /* use default salt length */, iterations, pkey)) {
        goto err;
      }
    }
    size_t name_len = 0;
    if (name) {
      name_len = strlen(name);
    }
    if (!add_bag_attributes(&bag, name, name_len, key_id, key_id_len) ||
        !CBB_flush(&content_infos)) {
      goto err;
    }
  }

  {
    // Compute the MAC. Match OpenSSL in using SHA-1 as the hash function. The
    // MAC covers |auth_safe_data|.
    const EVP_MD *mac_md = EVP_sha1();
    uint8_t mac_salt[PKCS5_SALT_LEN];
    uint8_t mac[EVP_MAX_MD_SIZE];
    unsigned mac_len;
    if (!CBB_flush(&auth_safe_data) ||
        !RAND_bytes(mac_salt, sizeof(mac_salt)) ||
        !pkcs12_key_gen(password, password_len, mac_salt, sizeof(mac_salt),
                        PKCS12_MAC_ID, mac_iterations, EVP_MD_size(mac_md),
                        mac_key, mac_md) ||
        !HMAC(mac_md, mac_key, EVP_MD_size(mac_md), CBB_data(&auth_safe_data),
              CBB_len(&auth_safe_data), mac, &mac_len)) {
      goto err;
    }

    CBB mac_data, digest_info;
    if (!CBB_add_asn1(&pfx, &mac_data, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1(&mac_data, &digest_info, CBS_ASN1_SEQUENCE) ||
        // OpenSSL and NSS always include a NULL parameter with the digest
        // algorithm. Windows does not. RFC 7292 imports DigestInfo from PKCS
        // #7. PKCS #7 does not actually use DigestInfo. It just describes
        // RSASSA-PKCS1-v1_5 signing as encoding a DigestInfo and then
        // "encrypting" it with the private key. In that context, NULL should be
        // included. Confusingly, there is also a digestAlgorithm field in
        // SignerInfo. There, RFC 5754 says to omit the NULL. But that field
        // does not use DigestInfo per se.
        //
        // We match OpenSSL, NSS, and RSASSA-PKCS1-v1_5 in including the NULL.
        !EVP_marshal_digest_algorithm(&digest_info, mac_md) ||
        !CBB_add_asn1_octet_string(&digest_info, mac, mac_len) ||
        !CBB_add_asn1_octet_string(&mac_data, mac_salt, sizeof(mac_salt)) ||
        // The iteration count has a DEFAULT of 1, but RFC 7292 says "The
        // default is for historical reasons and its use is deprecated." Thus we
        // explicitly encode the iteration count, though it is not valid DER.
        !CBB_add_asn1_uint64(&mac_data, mac_iterations)) {
      goto err;
    }

    ret = reinterpret_cast<PKCS12 *>(OPENSSL_malloc(sizeof(PKCS12)));
    if (ret == NULL || !CBB_finish(&cbb, &ret->ber_bytes, &ret->ber_len)) {
      OPENSSL_free(ret);
      ret = NULL;
      goto err;
    }
  }

err:
  OPENSSL_cleanse(mac_key, sizeof(mac_key));
  CBB_cleanup(&cbb);
  return ret;
}